

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurseSolution.cpp
# Opt level: O3

bool __thiscall NurseSolution::removeTurn(NurseSolution *this,Turn *turn)

{
  Turn **__src;
  Turn **ppTVar1;
  __normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_> _Var2;
  __normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_> __dest;
  Turn **ppTVar3;
  Turn *local_28;
  Turn *local_20;
  
  local_28 = turn;
  local_20 = turn;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<Turn**,std::vector<Turn*,std::allocator<Turn*>>>,__gnu_cxx::__ops::_Iter_equals_val<Turn_const*const>>
                    ((this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  ppTVar1 = (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (_Var2._M_current != ppTVar1) {
    __dest = std::
             __find_if<__gnu_cxx::__normal_iterator<Turn**,std::vector<Turn*,std::allocator<Turn*>>>,__gnu_cxx::__ops::_Iter_equals_val<Turn*const>>
                       ((this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                        super__Vector_impl_data._M_start,ppTVar1,&local_28);
    __src = __dest._M_current + 1;
    ppTVar3 = (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (__src != ppTVar3) {
      memmove(__dest._M_current,__src,(long)ppTVar3 - (long)__src);
      ppTVar3 = (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar3 + -1;
  }
  return _Var2._M_current != ppTVar1;
}

Assistant:

const bool NurseSolution::removeTurn( Turn *turn) {
    if (!hasTurn(turn))
        return false;

    turns.erase(find(begin(turns), end(turns), turn));

    return true;
}